

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void francisQR(double *A,int N)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *x_00;
  double *v_00;
  double *A_00;
  double *C;
  double dVar4;
  int NN;
  double *w;
  double *AT;
  double *v;
  double *x;
  double beta;
  double t2;
  double s;
  int j;
  int i;
  int u;
  int t;
  int r;
  int q;
  int k;
  int n;
  int m;
  int N_local;
  double *A_local;
  
  x_00 = (double *)malloc(0x18);
  v_00 = (double *)malloc(0x18);
  A_00 = (double *)malloc((long)N * 0x18);
  C = (double *)malloc((long)N << 3);
  iVar2 = N + -1;
  iVar3 = N * N;
  dVar4 = A[iVar3 + -1];
  dVar1 = A[(iVar3 - N) + -2];
  *x_00 = -(dVar4 + dVar1) * *A + *A * *A + A[1] * A[N] +
          A[iVar3 + -1] * A[(iVar3 - N) + -2] + -(A[iVar3 + -2] * A[(iVar3 - N) + -1]);
  x_00[1] = A[N] * ((*A + A[N + 1]) - (dVar4 + dVar1));
  x_00[2] = A[N] * A[N * 2 + 1];
  if (2 < N) {
    for (r = -1; r < N + -3; r = r + 1) {
      dVar4 = house(x_00,3,v_00);
      s._4_4_ = r;
      if (r < 1) {
        t = 0;
      }
      else {
        t = r;
      }
      while (s._4_4_ = s._4_4_ + 1, s._4_4_ < r + 4) {
        j = 0;
        for (s._0_4_ = t; s._0_4_ < N; s._0_4_ = s._0_4_ + 1) {
          A_00[((j + s._4_4_) - r) + -1] = A[s._0_4_ + s._4_4_ * N];
          j = j + 3;
        }
      }
      mmult(A_00,v_00,C,N - t,3,1);
      scale(C,N - t,1,dVar4);
      mmult(v_00,C,A_00,3,1,N - t);
      s._4_4_ = r;
      while (s._4_4_ = s._4_4_ + 1, s._4_4_ < r + 4) {
        for (s._0_4_ = t; s._0_4_ < N; s._0_4_ = s._0_4_ + 1) {
          iVar3 = s._4_4_ * N + s._0_4_;
          A[iVar3] = A[iVar3] - A_00[(((s._4_4_ - r) + -1) * (N - t) + s._0_4_) - t];
        }
      }
      u = N;
      if (r + 4 < iVar2) {
        u = r + 5;
      }
      for (s._4_4_ = 0; s._4_4_ < u; s._4_4_ = s._4_4_ + 1) {
        s._0_4_ = r;
        while (s._0_4_ = s._0_4_ + 1, s._0_4_ < r + 4) {
          A_00[((s._4_4_ * 3 + s._0_4_) - r) + -1] = A[s._4_4_ * N + s._0_4_];
        }
      }
      mmult(A_00,v_00,C,u,3,1);
      scale(C,u,1,dVar4);
      mmult(C,v_00,A_00,u,1,3);
      for (s._4_4_ = 0; s._4_4_ < u; s._4_4_ = s._4_4_ + 1) {
        s._0_4_ = r;
        while (s._0_4_ = s._0_4_ + 1, s._0_4_ < r + 4) {
          iVar3 = s._4_4_ * N + s._0_4_;
          A[iVar3] = A[iVar3] - A_00[((s._4_4_ * 3 + s._0_4_) - r) + -1];
        }
      }
      *x_00 = A[N * (r + 2) + r + 1];
      x_00[1] = A[N * (r + 3) + r + 1];
      if (r < N + -4) {
        x_00[2] = A[N * (r + 4) + r + 1];
      }
    }
    dVar4 = house(x_00,2,v_00);
    for (s._4_4_ = N + -2; s._4_4_ < N; s._4_4_ = s._4_4_ + 1) {
      j = 0;
      for (s._0_4_ = N + -3; s._0_4_ < N; s._0_4_ = s._0_4_ + 1) {
        A_00[((j + s._4_4_) - iVar2) + 1] = A[s._0_4_ + s._4_4_ * N];
        j = j + 2;
      }
    }
    mmult(A_00,v_00,C,3,2,1);
    scale(C,3,1,dVar4);
    mmult(v_00,C,A_00,2,1,3);
    for (s._4_4_ = N + -2; s._4_4_ < N; s._4_4_ = s._4_4_ + 1) {
      for (s._0_4_ = N + -3; s._0_4_ < N; s._0_4_ = s._0_4_ + 1) {
        iVar3 = s._4_4_ * N + s._0_4_;
        A[iVar3] = A[iVar3] - A_00[s._4_4_ * 3 + iVar2 * -4 + s._0_4_ + 5];
      }
    }
    for (s._4_4_ = 0; s._4_4_ < N; s._4_4_ = s._4_4_ + 1) {
      for (s._0_4_ = N + -2; s._0_4_ < N; s._0_4_ = s._0_4_ + 1) {
        A_00[((s._4_4_ * 2 + s._0_4_) - iVar2) + 1] = A[s._4_4_ * N + s._0_4_];
      }
    }
    mmult(A_00,v_00,C,N,2,1);
    scale(C,N,1,dVar4);
    mmult(C,v_00,A_00,N,1,2);
    for (s._4_4_ = 0; s._4_4_ < N; s._4_4_ = s._4_4_ + 1) {
      for (s._0_4_ = N + -2; s._0_4_ < N; s._0_4_ = s._0_4_ + 1) {
        iVar3 = s._4_4_ * N + s._0_4_;
        A[iVar3] = A[iVar3] - A_00[((s._4_4_ * 2 + s._0_4_) - iVar2) + 1];
      }
    }
    free(x_00);
    free(v_00);
    free(A_00);
    free(C);
  }
  return;
}

Assistant:

void francisQR(double *A,int N) {
	int m,n,k,q,r,t,u,i,j;
	double s,t2,beta;
	double *x,*v,*AT,*w;
	int NN;
	/*
	 * Reference - Algorithm 7.5.1 Golub,van Loan Matrix Computations 3rd Edition
	 */ 
	x = (double*) malloc(sizeof(double) * 3);
	v = (double*) malloc(sizeof(double) * 3);
	AT = (double*) malloc(sizeof(double) * 3 * N);
	w = (double*) malloc(sizeof(double) * N);
	n = N-1;
	m = n-1;
	NN = N*N;
	
	s = A[NN-1] + A[NN-N-2];
	t2 = A[NN-1] * A[NN-N-2] - A[NN-2] * A[NN-N-1];
	
	x[0] = A[0]*A[0] + A[1]*A[N] - s*A[0] + t2;
	x[1] = A[N]*(A[0] + A[N+1] - s);
	x[2] = A[N] * A[N+N+1];
	if (N <= 2) {
		return;
	}
	
	for (k = -1; k < N - 3;++k) {
		
		beta = house(x,3,v);
		//mdisplay(x,3,1);
		if (k > 0) {
			q = k;
		} else {
			q = 0;
		}
		
		//printf("q %d \n",q);
		for (i=k+1; i < k+4; i++) {
			t = i * N;
			u = 0;
			for (j=q; j < N; j++) {
				AT[u+i-k-1] = A[j+t];
				u+=3;		
			}
		}
		
		mmult(AT,v,w,N-q,3,1);
		scale(w,N-q,1,beta);
		mmult(v,w,AT,3,1,N-q);
		
		for (i=k+1; i < k+4; i++) {
			t = i * N;
			for (j=q; j < N; j++) {
				A[t+j] -= AT[(i-k-1)*(N-q) + j - q];
			}
		}
		//mdisplay(A,N,N);
		if (k+4 >= n) {
			r = N;
		} else {
			r = k+4+1;
		}
		//printf("r %d \n",r);
		for (i=0; i < r; i++) {
			t = i * N;
			u = i * 3;
			for (j=k+1; j < k+4; j++) {
				AT[u+j-k-1] = A[t+j];
			}
		}
		
		mmult(AT,v,w,r,3,1);
		scale(w,r,1,beta);
		mmult(w,v,AT,r,1,3);
		//mdisplay(AT,N,N-k-1);
		
		for (i=0; i < r; i++) {
			t = i * N;
			u = i * 3;
			for (j=k+1; j < k+4; j++) {
				A[t+j] -= AT[u+j-k-1];
			}
		}
		//mdisplay(A,N,N);
		x[0] = A[N*(k+2) + k+1];
		x[1] = A[N*(k+3) + k+1];
		
		if (k < n-3) {
			x[2] = A[N*(k+4) + k+1];
		} 
		//mdisplay(x,3,1);
		
	}
	//mdisplay(x,2,1);
	beta = house(x,2,v);
	
	for (i=n-1; i < N; i++) {
		t = i * N;
		u = 0;
		for (j=n-2; j < N; j++) {
			AT[u+i-n+1] = A[j+t];
			u+=2;		
		}
	}
	
	mmult(AT,v,w,3,2,1);
	scale(w,3,1,beta);
	mmult(v,w,AT,2,1,3);
	for (i=n-1; i < N; i++) {
		t = i * N;
		for (j=n-2; j < N; j++) {
			A[t+j] -= AT[(i-n+1)*3 + j - n + 2];
		}
	}
	
	for (i=0; i < N; i++) {
		t = i * N;
		u = i * 2;
		for (j=n-1; j < N; j++) {
			AT[u+j-n+1] = A[t+j];
		}
	}
	
	mmult(AT,v,w,N,2,1);
	scale(w,N,1,beta);
	mmult(w,v,AT,N,1,2);
		//mdisplay(AT,N,N-k-1);
		
	for (i=0; i < N; i++) {
		t = i * N;
		u = i * 2;
		for (j=n-1; j < N; j++) {
			A[t+j] -= AT[u+j-n+1];
		}
	}
	
	
	free(x);
	free(v);
	free(AT);
	free(w);
	
}